

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist_test.cpp
# Opt level: O0

pint p_test_case_plist_general_test(void)

{
  pint pVar1;
  long lVar2;
  undefined8 *puVar3;
  int local_20;
  int local_1c;
  TestData test_data;
  PList *list;
  
  p_test_module_fail_counter = 0;
  test_data.test_array[2] = 0;
  test_data.index = 0;
  p_libsys_init();
  test_data._8_8_ = p_list_append(test_data._8_8_,0x20);
  test_data._8_8_ = p_list_append(test_data._8_8_,0x40);
  if (test_data._8_8_ == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x76);
    exit(-1);
  }
  lVar2 = p_list_length(test_data._8_8_);
  if (lVar2 != 2) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x77);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if ((int)*(undefined8 *)test_data._8_8_ != 0x20) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x7a);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  puVar3 = (undefined8 *)p_list_last(test_data._8_8_);
  if ((int)*puVar3 != 0x40) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x7b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  test_data._8_8_ = p_list_prepend(test_data._8_8_);
  if (test_data._8_8_ == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x7f);
    exit(-1);
  }
  lVar2 = p_list_length(test_data._8_8_);
  if (lVar2 != 3) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x80);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if ((int)*(undefined8 *)test_data._8_8_ != 0x80) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x81);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  puVar3 = (undefined8 *)p_list_last(test_data._8_8_);
  if ((int)*puVar3 != 0x40) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x82);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  memset(&local_20,0,0x10);
  if (local_20 != 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x87);
    exit(-1);
  }
  if (local_1c != 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x88);
    exit(-1);
  }
  if (test_data.test_array[0] != 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x89);
    exit(-1);
  }
  if (test_data.test_array[1] != 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x8a);
    exit(-1);
  }
  p_list_foreach(test_data._8_8_,foreach_test_func,&local_20);
  if (test_data.test_array[1] != 3) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x8e);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_20 != 0x80) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x8f);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_1c != 0x20) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x90);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (test_data.test_array[0] != 0x40) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x91);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  test_data._8_8_ = p_list_reverse(test_data._8_8_);
  if (test_data._8_8_ == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x97);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar2 = p_list_length(test_data._8_8_);
  if (lVar2 != 3) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x98);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if ((int)*(undefined8 *)test_data._8_8_ != 0x40) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x99);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  puVar3 = (undefined8 *)p_list_last(test_data._8_8_);
  if ((int)*puVar3 != 0x80) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x9a);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  memset(&local_20,0,0x10);
  if (local_20 != 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x9f);
    exit(-1);
  }
  if (local_1c != 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xa0);
    exit(-1);
  }
  if (test_data.test_array[0] != 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xa1);
    exit(-1);
  }
  if (test_data.test_array[1] != 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xa2);
    exit(-1);
  }
  p_list_foreach(test_data._8_8_,foreach_test_func,&local_20);
  if (test_data.test_array[1] != 3) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xa6);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_20 != 0x40) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xa7);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (local_1c != 0x20) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xa8);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (test_data.test_array[0] != 0x80) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xa9);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  test_data._8_8_ = p_list_remove(test_data._8_8_,0x20);
  if (test_data._8_8_ == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xad);
    exit(-1);
  }
  lVar2 = p_list_length(test_data._8_8_);
  if (lVar2 != 2) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xae);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  test_data._8_8_ = p_list_remove(test_data._8_8_,0x80);
  if (test_data._8_8_ == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xb1);
    exit(-1);
  }
  lVar2 = p_list_length(test_data._8_8_);
  if (lVar2 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xb2);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  test_data._8_8_ = p_list_remove(test_data._8_8_,0x100);
  if (test_data._8_8_ == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xb5);
    exit(-1);
  }
  lVar2 = p_list_length(test_data._8_8_);
  if (lVar2 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xb6);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  test_data._8_8_ = p_list_remove(test_data._8_8_,0x40);
  if (test_data._8_8_ != 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xb9);
    exit(-1);
  }
  lVar2 = p_list_length(0);
  if (lVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0xba);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_list_free(test_data._8_8_);
  p_libsys_shutdown();
  pVar1 = -1;
  if (p_test_module_fail_counter == 0) {
    pVar1 = 0;
  }
  return pVar1;
}

Assistant:

P_TEST_CASE_BEGIN (plist_general_test)
{
	PList		*list = NULL;
	TestData	test_data;

	p_libsys_init ();

	/* Testing append */
	list = p_list_append (list, P_INT_TO_POINTER (32));
	list = p_list_append (list, P_INT_TO_POINTER (64));

	P_TEST_REQUIRE (list != NULL);
	P_TEST_CHECK (p_list_length (list) == 2);

	/* Testing data access */
	P_TEST_CHECK (P_POINTER_TO_INT (list->data) == 32);
	P_TEST_CHECK (P_POINTER_TO_INT (p_list_last(list)->data) == 64);

	/* Testing prepend */
	list = p_list_prepend (list, P_INT_TO_POINTER (128));
	P_TEST_REQUIRE (list != NULL);
	P_TEST_CHECK (p_list_length (list) == 3);
	P_TEST_CHECK (P_POINTER_TO_INT (list->data) == 128);
	P_TEST_CHECK (P_POINTER_TO_INT (p_list_last(list)->data) == 64);

	/* Testing for each loop */
	memset (&test_data, 0, sizeof (test_data));

	P_TEST_REQUIRE (test_data.test_array[0] == 0);
	P_TEST_REQUIRE (test_data.test_array[1] == 0);
	P_TEST_REQUIRE (test_data.test_array[2] == 0);
	P_TEST_REQUIRE (test_data.index == 0);

	p_list_foreach (list, (PFunc) foreach_test_func, (ppointer) &test_data);

	P_TEST_CHECK (test_data.index == 3);
	P_TEST_CHECK (test_data.test_array[0] == 128);
	P_TEST_CHECK (test_data.test_array[1] == 32);
	P_TEST_CHECK (test_data.test_array[2] == 64);

	/* Testing reverse */

	list = p_list_reverse (list);

	P_TEST_CHECK (list != NULL);
	P_TEST_CHECK (p_list_length (list) == 3);
	P_TEST_CHECK (P_POINTER_TO_INT (list->data) == 64);
	P_TEST_CHECK (P_POINTER_TO_INT (p_list_last(list)->data) == 128);

	/* Testing for each loop */
	memset (&test_data, 0, sizeof (test_data));

	P_TEST_REQUIRE (test_data.test_array[0] == 0);
	P_TEST_REQUIRE (test_data.test_array[1] == 0);
	P_TEST_REQUIRE (test_data.test_array[2] == 0);
	P_TEST_REQUIRE (test_data.index == 0);

	p_list_foreach (list, (PFunc) foreach_test_func, (ppointer) &test_data);

	P_TEST_CHECK (test_data.index == 3);
	P_TEST_CHECK (test_data.test_array[0] == 64);
	P_TEST_CHECK (test_data.test_array[1] == 32);
	P_TEST_CHECK (test_data.test_array[2] == 128);

	/* Testing remove */
	list = p_list_remove (list, P_INT_TO_POINTER (32));
	P_TEST_REQUIRE (list != NULL);
	P_TEST_CHECK (p_list_length (list) == 2);

	list = p_list_remove (list, P_INT_TO_POINTER (128));
	P_TEST_REQUIRE (list != NULL);
	P_TEST_CHECK (p_list_length (list) == 1);

	list = p_list_remove (list, P_INT_TO_POINTER (256));
	P_TEST_REQUIRE (list != NULL);
	P_TEST_CHECK (p_list_length (list) == 1);

	list = p_list_remove (list, P_INT_TO_POINTER (64));
	P_TEST_REQUIRE (list == NULL);
	P_TEST_CHECK (p_list_length (list) == 0);

	p_list_free (list);

	p_libsys_shutdown ();
}